

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
::
List_column<std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>>>>>
          (List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
           *this,List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                 *column,Index columnIndex,
          map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  bool bVar1;
  ID_index rowIndex;
  size_type __n;
  Column_support *this_00;
  reference ppEVar2;
  uint *value;
  Entry_constructor *local_b8;
  Field_operators *local_a8;
  iterator local_78;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
  *local_70;
  Entry *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Column_support *__range3;
  iterator it;
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>
  local_31;
  Column_settings *local_30;
  Column_settings *colSettings_local;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
  *rowContainer_local;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
  *pLStack_18;
  Index columnIndex_local;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
  *column_local;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
  *this_local;
  
  local_30 = colSettings;
  colSettings_local = (Column_settings *)rowContainer;
  rowContainer_local._4_4_ = columnIndex;
  pLStack_18 = column;
  column_local = (List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                  *)this;
  Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
  ::Row_access((Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                *)this,columnIndex,rowContainer);
  Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
  ::Column_dimension_holder
            ((Column_dimension_holder<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
              *)(this + 0x10),&pLStack_18->super_Column_dimension_option);
  __n = std::__cxx11::
        list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
        ::size(&pLStack_18->column_);
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>
  ::allocator(&local_31);
  std::__cxx11::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
  ::list((list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
          *)(this + 0x18),__n,&local_31);
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>
  ::~allocator(&local_31);
  if (local_30 == (Column_settings *)0x0) {
    local_a8 = pLStack_18->operators_;
  }
  else {
    local_a8 = (Field_operators *)0x0;
  }
  *(Field_operators **)(this + 0x30) = local_a8;
  if (local_30 == (Column_settings *)0x0) {
    local_b8 = pLStack_18->entryPool_;
  }
  else {
    local_b8 = (Entry_constructor *)&local_30->field_0x20;
  }
  *(Entry_constructor **)(this + 0x38) = local_b8;
  if (local_30 != (Column_settings *)0x0) {
    *(Column_settings **)(this + 0x30) = local_30;
  }
  __range3 = (Column_support *)
             std::__cxx11::
             list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
             ::begin((list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
                      *)(this + 0x18));
  this_00 = &pLStack_18->column_;
  __end0 = std::__cxx11::
           list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
           ::begin(this_00);
  entry = (Entry *)std::__cxx11::
                   list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
                   ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&entry);
    if (!bVar1) break;
    ppEVar2 = std::
              _List_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>
              ::operator*(&__end0);
    local_70 = *ppEVar2;
    value = Entry_field_element<unsigned_int>::get_element
                      (&local_70->super_Entry_field_element_option);
    rowIndex = Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
               ::get_row_index(local_70);
    local_78._M_node =
         (_List_node_base *)
         std::
         _List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>
         ::operator++((_List_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>
                       *)&__range3,0);
    List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
    ::_update_entry((List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                     *)this,value,rowIndex,&local_78);
    std::
    _List_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline List_column<Master_matrix>::List_column(const List_column& column,
                                               Index columnIndex,
                                               Row_container* rowContainer,
                                               Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.size()),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  auto it = column_.begin();
  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _update_entry(entry->get_row_index(), it++);
    } else {
      _update_entry(entry->get_element(), entry->get_row_index(), it++);
    }
  }
}